

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# append.cpp
# Opt level: O2

int main(void)

{
  variant<int,_float,_double> ele;
  variant<int,_float,_double> ele_00;
  int iVar1;
  ostream *poVar2;
  int i;
  int index;
  heterovector hetvec;
  
  hetvec.vec.
  super__Vector_base<std::variant<int,_float,_double>,_std::allocator<std::variant<int,_float,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  hetvec.vec.
  super__Vector_base<std::variant<int,_float,_double>,_std::allocator<std::variant<int,_float,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  hetvec.vec.
  super__Vector_base<std::variant<int,_float,_double>,_std::allocator<std::variant<int,_float,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  heterovector::append(&hetvec,(variant<int,_float,_double>)ZEXT816(0));
  ele.super__Variant_base<int,_float,_double>.super__Move_assign_alias<int,_float,_double>.
  super__Copy_assign_alias<int,_float,_double>.super__Move_ctor_alias<int,_float,_double>.
  super__Copy_ctor_alias<int,_float,_double>.super__Variant_storage_alias<int,_float,_double>._8_8_
       = hetvec.vec.
         super__Vector_base<std::variant<int,_float,_double>,_std::allocator<std::variant<int,_float,_double>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  ele.super__Variant_base<int,_float,_double>.super__Move_assign_alias<int,_float,_double>.
  super__Copy_assign_alias<int,_float,_double>.super__Move_ctor_alias<int,_float,_double>.
  super__Copy_ctor_alias<int,_float,_double>.super__Variant_storage_alias<int,_float,_double>._M_u =
       (_Variadic_union<int,_float,_double>)
       hetvec.vec.
       super__Vector_base<std::variant<int,_float,_double>,_std::allocator<std::variant<int,_float,_double>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  heterovector::append(&hetvec,ele);
  ele_00.super__Variant_base<int,_float,_double>.super__Move_assign_alias<int,_float,_double>.
  super__Copy_assign_alias<int,_float,_double>.super__Move_ctor_alias<int,_float,_double>.
  super__Copy_ctor_alias<int,_float,_double>.super__Variant_storage_alias<int,_float,_double>._8_8_
       = hetvec.vec.
         super__Vector_base<std::variant<int,_float,_double>,_std::allocator<std::variant<int,_float,_double>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  ele_00.super__Variant_base<int,_float,_double>.super__Move_assign_alias<int,_float,_double>.
  super__Copy_assign_alias<int,_float,_double>.super__Move_ctor_alias<int,_float,_double>.
  super__Copy_ctor_alias<int,_float,_double>.super__Variant_storage_alias<int,_float,_double>._M_u =
       (_Variadic_union<int,_float,_double>)
       hetvec.vec.
       super__Vector_base<std::variant<int,_float,_double>,_std::allocator<std::variant<int,_float,_double>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  heterovector::append(&hetvec,ele_00);
  for (index = 0; index != 3; index = index + 1) {
    iVar1 = heterovector::get<int>(&hetvec,index);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  std::
  _Vector_base<std::variant<int,_float,_double>,_std::allocator<std::variant<int,_float,_double>_>_>
  ::~_Vector_base((_Vector_base<std::variant<int,_float,_double>,_std::allocator<std::variant<int,_float,_double>_>_>
                   *)&hetvec);
  return 0;
}

Assistant:

int main() {
    heterovector hetvec;

    hetvec.append(3);
    hetvec.append(1);
    hetvec.append(0);

    for (int i = 0; i < 3; i++) {
        std::cout << hetvec.get<int>(i) << std::endl;
    }

    return 0;
}